

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

int stbtt__run_charstring(stbtt_fontinfo *info,int glyph_index,stbtt__csctx *c)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int dx1_00;
  int dy1_00;
  byte bVar4;
  stbtt_uint8 sVar5;
  stbtt_uint32 sVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  double dVar10;
  double dVar11;
  stbtt__buf sVar12;
  stbtt__buf *local_2b8;
  float local_2ac;
  float local_294;
  int b1;
  float dy;
  float dx;
  float dy6;
  float dy5;
  float dy4;
  float dy3;
  float dy2;
  float dy1;
  float dx6;
  float dx5;
  float dx4;
  float dx3;
  float dx2;
  float dx1;
  uchar *local_220;
  uchar *local_210;
  uchar *local_1f0;
  uchar *local_1e8;
  float local_1dc;
  undefined1 auStack_1d8 [4];
  float f;
  stbtt__buf b;
  stbtt__buf subrs;
  stbtt__buf subr_stack [10];
  float s [48];
  int clear_stack;
  int has_subrs;
  int b0;
  int i;
  int v;
  int sp;
  int subr_stack_height;
  int maskbits;
  int in_header;
  stbtt__csctx *c_local;
  int glyph_index_local;
  stbtt_fontinfo *info_local;
  
  bVar1 = true;
  sp = 0;
  v = 0;
  i = 0;
  bVar2 = false;
  b._8_8_ = (info->subrs).data;
  sVar12 = stbtt__cff_index_get(info->charstrings,glyph_index);
  local_1f0 = sVar12.data;
  _auStack_1d8 = local_1f0;
  local_1e8 = sVar12._8_8_;
  b.data = local_1e8;
  do {
    if ((int)b.data._4_4_ <= (int)b.data) {
      return 0;
    }
    has_subrs = 0;
    bVar3 = true;
    bVar4 = stbtt__buf_get8((stbtt__buf *)auStack_1d8);
    switch(bVar4) {
    case 1:
    case 3:
    case 0x12:
    case 0x17:
      sp = i / 2 + sp;
      break;
    default:
      if (((bVar4 != 0xff) && (bVar4 != 0x1c)) && ((bVar4 < 0x20 || (bVar4 == 0xff)))) {
        return 0;
      }
      if (bVar4 == 0xff) {
        sVar6 = stbtt__buf_get((stbtt__buf *)auStack_1d8,4);
        local_1dc = (float)(int)sVar6 / 65536.0;
      }
      else {
        stbtt__buf_skip((stbtt__buf *)auStack_1d8,-1);
        sVar6 = stbtt__cff_int((stbtt__buf *)auStack_1d8);
        local_1dc = (float)(int)(short)sVar6;
      }
      if (0x2f < i) {
        return 0;
      }
      s[(long)i + -2] = local_1dc;
      bVar3 = false;
      i = i + 1;
      break;
    case 4:
      bVar1 = false;
      if (i < 1) {
        return 0;
      }
      stbtt__csctx_rmove_to(c,0.0,s[(long)(i + -1) + -2]);
      break;
    case 5:
      if (i < 2) {
        return 0;
      }
      for (; has_subrs + 1 < i; has_subrs = has_subrs + 2) {
        stbtt__csctx_rline_to(c,s[(long)has_subrs + -2],s[(long)(has_subrs + 1) + -2]);
      }
      break;
    case 6:
      if (i < 1) {
        return 0;
      }
      for (; has_subrs < i; has_subrs = has_subrs + 1) {
        stbtt__csctx_rline_to(c,s[(long)has_subrs + -2],0.0);
        has_subrs = has_subrs + 1;
LAB_0019345b:
        if (i <= has_subrs) break;
        stbtt__csctx_rline_to(c,0.0,s[(long)has_subrs + -2]);
      }
      break;
    case 7:
      if (0 < i) goto LAB_0019345b;
      return 0;
    case 8:
      if (i < 6) {
        return 0;
      }
      for (; has_subrs + 5 < i; has_subrs = has_subrs + 6) {
        stbtt__csctx_rccurve_to
                  (c,s[(long)has_subrs + -2],s[(long)(has_subrs + 1) + -2],
                   s[(long)(has_subrs + 2) + -2],s[(long)(has_subrs + 3) + -2],
                   s[(long)(has_subrs + 4) + -2],s[(long)(has_subrs + 5) + -2]);
      }
      break;
    case 10:
      if (!bVar2) {
        if ((info->fdselect).size != 0) {
          sVar12 = stbtt__cid_get_glyph_subrs(info,glyph_index);
          local_210 = sVar12.data;
          b._8_8_ = local_210;
        }
        bVar2 = true;
      }
    case 0x1d:
      if (i < 1) {
        return 0;
      }
      i = i + -1;
      fVar8 = s[(long)i + -2];
      if (9 < v) {
        return 0;
      }
      *(uchar **)&subr_stack[(long)v + -1].cursor = _auStack_1d8;
      subr_stack[v].data = b.data;
      if (bVar4 == 10) {
        local_2b8 = (stbtt__buf *)&b.cursor;
      }
      else {
        local_2b8 = &info->gsubrs;
      }
      sVar12 = stbtt__get_subr(*local_2b8,(int)fVar8);
      local_220 = sVar12.data;
      _auStack_1d8 = local_220;
      b.data._4_4_ = sVar12.size;
      if (b.data._4_4_ == 0) {
        return 0;
      }
      b.data = (uchar *)((ulong)b.data._4_4_ << 0x20);
      bVar3 = false;
      v = v + 1;
      break;
    case 0xb:
      if (v < 1) {
        return 0;
      }
      v = v + -1;
      _auStack_1d8 = *(uchar **)&subr_stack[(long)v + -1].cursor;
      b.data = subr_stack[v].data;
      bVar3 = false;
      break;
    case 0xc:
      sVar5 = stbtt__buf_get8((stbtt__buf *)auStack_1d8);
      dy1_00 = subr_stack[9].size;
      dx1_00 = subr_stack[9].cursor;
      switch(sVar5) {
      case '\"':
        if (i < 7) {
          return 0;
        }
        stbtt__csctx_rccurve_to
                  (c,(float)subr_stack[9].cursor,0.0,(float)subr_stack[9].size,s[0],s[1],0.0);
        stbtt__csctx_rccurve_to(c,s[2],0.0,s[3],-s[0],s[4],0.0);
        break;
      case '#':
        if (i < 0xd) {
          return 0;
        }
        stbtt__csctx_rccurve_to
                  (c,(float)subr_stack[9].cursor,(float)subr_stack[9].size,s[0],s[1],s[2],s[3]);
        stbtt__csctx_rccurve_to(c,s[4],s[5],s[6],s[7],s[8],s[9]);
        break;
      case '$':
        if (i < 9) {
          return 0;
        }
        stbtt__csctx_rccurve_to
                  (c,(float)subr_stack[9].cursor,(float)subr_stack[9].size,s[0],s[1],s[2],0.0);
        stbtt__csctx_rccurve_to(c,s[3],0.0,s[4],s[5],s[6],-((float)dy1_00 + s[1] + s[5]));
        break;
      case '%':
        if (i < 0xb) {
          return 0;
        }
        dy = s[8];
        dy2 = s[8];
        fVar8 = (float)subr_stack[9].cursor + s[0] + s[2] + s[4] + s[6];
        fVar9 = (float)subr_stack[9].size + s[1] + s[3] + s[5] + s[7];
        dVar10 = std::fabs((double)(ulong)(uint)fVar8);
        dVar11 = std::fabs((double)(ulong)(uint)fVar9);
        if (SUB84(dVar10,0) <= SUB84(dVar11,0)) {
          dy2 = -fVar8;
        }
        else {
          dy = -fVar9;
        }
        stbtt__csctx_rccurve_to(c,(float)dx1_00,(float)dy1_00,s[0],s[1],s[2],s[3]);
        stbtt__csctx_rccurve_to(c,s[4],s[5],s[6],s[7],dy2,dy);
        break;
      default:
        return 0;
      }
      break;
    case 0xe:
      stbtt__csctx_close_shape(c);
      return 1;
    case 0x13:
    case 0x14:
      if (bVar1) {
        sp = i / 2 + sp;
      }
      bVar1 = false;
      stbtt__buf_skip((stbtt__buf *)auStack_1d8,(sp + 7) / 8);
      break;
    case 0x15:
      bVar1 = false;
      if (i < 2) {
        return 0;
      }
      stbtt__csctx_rmove_to(c,s[(long)(i + -2) + -2],s[(long)(i + -1) + -2]);
      break;
    case 0x16:
      bVar1 = false;
      if (i < 1) {
        return 0;
      }
      stbtt__csctx_rmove_to(c,s[(long)(i + -1) + -2],0.0);
      break;
    case 0x18:
      if (i < 8) {
        return 0;
      }
      for (; has_subrs + 5 < i + -2; has_subrs = has_subrs + 6) {
        stbtt__csctx_rccurve_to
                  (c,s[(long)has_subrs + -2],s[(long)(has_subrs + 1) + -2],
                   s[(long)(has_subrs + 2) + -2],s[(long)(has_subrs + 3) + -2],
                   s[(long)(has_subrs + 4) + -2],s[(long)(has_subrs + 5) + -2]);
      }
      if (i <= has_subrs + 1) {
        return 0;
      }
      stbtt__csctx_rline_to(c,s[(long)has_subrs + -2],s[(long)(has_subrs + 1) + -2]);
      break;
    case 0x19:
      if (i < 8) {
        return 0;
      }
      for (; has_subrs + 1 < i + -6; has_subrs = has_subrs + 2) {
        stbtt__csctx_rline_to(c,s[(long)has_subrs + -2],s[(long)(has_subrs + 1) + -2]);
      }
      if (i <= has_subrs + 5) {
        return 0;
      }
      stbtt__csctx_rccurve_to
                (c,s[(long)has_subrs + -2],s[(long)(has_subrs + 1) + -2],
                 s[(long)(has_subrs + 2) + -2],s[(long)(has_subrs + 3) + -2],
                 s[(long)(has_subrs + 4) + -2],s[(long)(has_subrs + 5) + -2]);
      break;
    case 0x1a:
    case 0x1b:
      if (i < 4) {
        return 0;
      }
      local_1dc = 0.0;
      bVar7 = (i & 1U) != 0;
      if (bVar7) {
        local_1dc = (float)subr_stack[9].cursor;
      }
      for (has_subrs = (int)bVar7; has_subrs + 3 < i; has_subrs = has_subrs + 4) {
        if (bVar4 == 0x1b) {
          stbtt__csctx_rccurve_to
                    (c,s[(long)has_subrs + -2],local_1dc,s[(long)(has_subrs + 1) + -2],
                     s[(long)(has_subrs + 2) + -2],s[(long)(has_subrs + 3) + -2],0.0);
        }
        else {
          stbtt__csctx_rccurve_to
                    (c,local_1dc,s[(long)has_subrs + -2],s[(long)(has_subrs + 1) + -2],
                     s[(long)(has_subrs + 2) + -2],0.0,s[(long)(has_subrs + 3) + -2]);
        }
        local_1dc = 0.0;
      }
      break;
    case 0x1e:
      if (i < 4) {
        return 0;
      }
      for (; has_subrs + 3 < i; has_subrs = has_subrs + 4) {
        if (i - has_subrs == 5) {
          local_294 = s[(long)(has_subrs + 4) + -2];
        }
        else {
          local_294 = 0.0;
        }
        stbtt__csctx_rccurve_to
                  (c,0.0,s[(long)has_subrs + -2],s[(long)(has_subrs + 1) + -2],
                   s[(long)(has_subrs + 2) + -2],s[(long)(has_subrs + 3) + -2],local_294);
        has_subrs = has_subrs + 4;
LAB_001935a7:
        if (i <= has_subrs + 3) break;
        if (i - has_subrs == 5) {
          local_2ac = s[(long)(has_subrs + 4) + -2];
        }
        else {
          local_2ac = 0.0;
        }
        stbtt__csctx_rccurve_to
                  (c,s[(long)has_subrs + -2],0.0,s[(long)(has_subrs + 1) + -2],
                   s[(long)(has_subrs + 2) + -2],local_2ac,s[(long)(has_subrs + 3) + -2]);
      }
      break;
    case 0x1f:
      if (3 < i) goto LAB_001935a7;
      return 0;
    }
    if (bVar3) {
      i = 0;
    }
  } while( true );
}

Assistant:

static int stbtt__run_charstring(const stbtt_fontinfo *info, int glyph_index, stbtt__csctx *c)
{
   int in_header = 1, maskbits = 0, subr_stack_height = 0, sp = 0, v, i, b0;
   int has_subrs = 0, clear_stack;
   float s[48];
   stbtt__buf subr_stack[10], subrs = info->subrs, b;
   float f;

#define STBTT__CSERR(s) (0)

   // this currently ignores the initial width value, which isn't needed if we have hmtx
   b = stbtt__cff_index_get(info->charstrings, glyph_index);
   while (b.cursor < b.size) {
      i = 0;
      clear_stack = 1;
      b0 = stbtt__buf_get8(&b);
      switch (b0) {
      // @TODO implement hinting
      case 0x13: // hintmask
      case 0x14: // cntrmask
         if (in_header)
            maskbits += (sp / 2); // implicit "vstem"
         in_header = 0;
         stbtt__buf_skip(&b, (maskbits + 7) / 8);
         break;

      case 0x01: // hstem
      case 0x03: // vstem
      case 0x12: // hstemhm
      case 0x17: // vstemhm
         maskbits += (sp / 2);
         break;

      case 0x15: // rmoveto
         in_header = 0;
         if (sp < 2) return STBTT__CSERR("rmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-2], s[sp-1]);
         break;
      case 0x04: // vmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("vmoveto stack");
         stbtt__csctx_rmove_to(c, 0, s[sp-1]);
         break;
      case 0x16: // hmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("hmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-1], 0);
         break;

      case 0x05: // rlineto
         if (sp < 2) return STBTT__CSERR("rlineto stack");
         for (; i + 1 < sp; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      // hlineto/vlineto and vhcurveto/hvcurveto alternate horizontal and vertical
      // starting from a different place.

      case 0x07: // vlineto
         if (sp < 1) return STBTT__CSERR("vlineto stack");
         goto vlineto;
      case 0x06: // hlineto
         if (sp < 1) return STBTT__CSERR("hlineto stack");
         for (;;) {
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, s[i], 0);
            i++;
      vlineto:
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, 0, s[i]);
            i++;
         }
         break;

      case 0x1F: // hvcurveto
         if (sp < 4) return STBTT__CSERR("hvcurveto stack");
         goto hvcurveto;
      case 0x1E: // vhcurveto
         if (sp < 4) return STBTT__CSERR("vhcurveto stack");
         for (;;) {
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, 0, s[i], s[i+1], s[i+2], s[i+3], (sp - i == 5) ? s[i + 4] : 0.0f);
            i += 4;
      hvcurveto:
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, s[i], 0, s[i+1], s[i+2], (sp - i == 5) ? s[i+4] : 0.0f, s[i+3]);
            i += 4;
         }
         break;

      case 0x08: // rrcurveto
         if (sp < 6) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x18: // rcurveline
         if (sp < 8) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp - 2; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         if (i + 1 >= sp) return STBTT__CSERR("rcurveline stack");
         stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      case 0x19: // rlinecurve
         if (sp < 8) return STBTT__CSERR("rlinecurve stack");
         for (; i + 1 < sp - 6; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         if (i + 5 >= sp) return STBTT__CSERR("rlinecurve stack");
         stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x1A: // vvcurveto
      case 0x1B: // hhcurveto
         if (sp < 4) return STBTT__CSERR("(vv|hh)curveto stack");
         f = 0.0;
         if (sp & 1) { f = s[i]; i++; }
         for (; i + 3 < sp; i += 4) {
            if (b0 == 0x1B)
               stbtt__csctx_rccurve_to(c, s[i], f, s[i+1], s[i+2], s[i+3], 0.0);
            else
               stbtt__csctx_rccurve_to(c, f, s[i], s[i+1], s[i+2], 0.0, s[i+3]);
            f = 0.0;
         }
         break;

      case 0x0A: // callsubr
         if (!has_subrs) {
            if (info->fdselect.size)
               subrs = stbtt__cid_get_glyph_subrs(info, glyph_index);
            has_subrs = 1;
         }
         // fallthrough
      case 0x1D: // callgsubr
         if (sp < 1) return STBTT__CSERR("call(g|)subr stack");
         v = (int) s[--sp];
         if (subr_stack_height >= 10) return STBTT__CSERR("recursion limit");
         subr_stack[subr_stack_height++] = b;
         b = stbtt__get_subr(b0 == 0x0A ? subrs : info->gsubrs, v);
         if (b.size == 0) return STBTT__CSERR("subr not found");
         b.cursor = 0;
         clear_stack = 0;
         break;

      case 0x0B: // return
         if (subr_stack_height <= 0) return STBTT__CSERR("return outside subr");
         b = subr_stack[--subr_stack_height];
         clear_stack = 0;
         break;

      case 0x0E: // endchar
         stbtt__csctx_close_shape(c);
         return 1;

      case 0x0C: { // two-byte escape
         float dx1, dx2, dx3, dx4, dx5, dx6, dy1, dy2, dy3, dy4, dy5, dy6;
         float dx, dy;
         int b1 = stbtt__buf_get8(&b);
         switch (b1) {
         // @TODO These "flex" implementations ignore the flex-depth and resolution,
         // and always draw beziers.
         case 0x22: // hflex
            if (sp < 7) return STBTT__CSERR("hflex stack");
            dx1 = s[0];
            dx2 = s[1];
            dy2 = s[2];
            dx3 = s[3];
            dx4 = s[4];
            dx5 = s[5];
            dx6 = s[6];
            stbtt__csctx_rccurve_to(c, dx1, 0, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, -dy2, dx6, 0);
            break;

         case 0x23: // flex
            if (sp < 13) return STBTT__CSERR("flex stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = s[10];
            dy6 = s[11];
            //fd is s[12]
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         case 0x24: // hflex1
            if (sp < 9) return STBTT__CSERR("hflex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dx4 = s[5];
            dx5 = s[6];
            dy5 = s[7];
            dx6 = s[8];
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, dy5, dx6, -(dy1+dy2+dy5));
            break;

         case 0x25: // flex1
            if (sp < 11) return STBTT__CSERR("flex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = dy6 = s[10];
            dx = dx1+dx2+dx3+dx4+dx5;
            dy = dy1+dy2+dy3+dy4+dy5;
            if (STBTT_fabs(dx) > STBTT_fabs(dy))
               dy6 = -dy;
            else
               dx6 = -dx;
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         default:
            return STBTT__CSERR("unimplemented");
         }
      } break;

      default:
         if (b0 != 255 && b0 != 28 && (b0 < 32 || b0 > 254))
            return STBTT__CSERR("reserved operator");

         // push immediate
         if (b0 == 255) {
            f = (float)(stbtt_int32)stbtt__buf_get32(&b) / 0x10000;
         } else {
            stbtt__buf_skip(&b, -1);
            f = (float)(stbtt_int16)stbtt__cff_int(&b);
         }
         if (sp >= 48) return STBTT__CSERR("push stack overflow");
         s[sp++] = f;
         clear_stack = 0;
         break;
      }
      if (clear_stack) sp = 0;
   }
   return STBTT__CSERR("no endchar");

#undef STBTT__CSERR
}